

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# render-data.cc
# Opt level: O0

string * __thiscall
tinyusdz::tydra::(anonymous_namespace)::DumpMesh_abi_cxx11_
          (string *__return_storage_ptr__,_anonymous_namespace_ *this,RenderMesh *mesh,
          uint32_t indent)

{
  RenderMesh *s;
  bool bVar1;
  ostream *poVar2;
  string *psVar3;
  size_type sVar4;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *pvVar5;
  size_type __val;
  unordered_map<unsigned_int,_tinyusdz::tydra::VertexAttribute,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_tinyusdz::tydra::VertexAttribute>_>_>
  *this_00;
  size_type sVar6;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::tydra::ShapeTarget,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::tydra::ShapeTarget>_>_>
  *this_01;
  ShapeTarget *pSVar7;
  size_type sVar8;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::tydra::MaterialSubset,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::tydra::MaterialSubset>_>_>
  *this_02;
  undefined4 in_register_0000000c;
  uint32_t n;
  uint32_t n_00;
  uint32_t n_01;
  uint32_t n_02;
  uint32_t n_03;
  uint32_t n_04;
  uint32_t n_05;
  uint32_t n_06;
  uint32_t n_07;
  uint32_t n_08;
  uint32_t n_09;
  uint32_t n_10;
  uint32_t n_11;
  uint32_t n_12;
  uint32_t n_13;
  uint32_t n_14;
  uint32_t n_15;
  uint32_t n_16;
  uint32_t n_17;
  uint32_t n_18;
  uint32_t extraout_EDX;
  uint32_t n_19;
  uint32_t n_20;
  uint32_t n_21;
  uint32_t n_22;
  uint32_t n_23;
  uint32_t n_24;
  uint32_t n_25;
  uint32_t n_26;
  uint32_t n_27;
  uint32_t n_28;
  uint32_t n_29;
  uint32_t n_30;
  uint32_t n_31;
  uint32_t n_32;
  uint32_t n_33;
  uint32_t n_34;
  uint32_t n_35;
  uint32_t n_36;
  uint32_t n_37;
  uint32_t n_38;
  matrix4d *v;
  string local_cc8;
  string local_ca8;
  reference local_c88;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::tydra::MaterialSubset>
  *msubset;
  const_iterator __end3_1;
  const_iterator __begin3_1;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::tydra::MaterialSubset,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::tydra::MaterialSubset>_>_>
  *__range3_1;
  string local_c48;
  string local_c28;
  allocator local_c01;
  string local_c00;
  string local_be0;
  string local_bc0;
  string local_ba0;
  allocator local_b79;
  string local_b78;
  string local_b58;
  string local_b38;
  string local_b18;
  allocator local_af1;
  string local_af0;
  string local_ad0;
  string local_ab0;
  string local_a90;
  allocator local_a69;
  string local_a68;
  string local_a48;
  string local_a28;
  allocator local_a01;
  string local_a00;
  string local_9e0;
  string local_9c0;
  allocator local_999;
  string local_998;
  string local_978;
  string local_958;
  string local_938;
  reference local_918;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::tydra::ShapeTarget>
  *target;
  const_iterator __end3;
  const_iterator __begin3;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::tydra::ShapeTarget,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::tydra::ShapeTarget>_>_>
  *__range3;
  string local_8d8;
  allocator local_8b1;
  string local_8b0;
  string local_890;
  string local_870;
  string local_850;
  allocator local_829;
  string local_828;
  string local_808;
  string local_7e8;
  string local_7c8;
  string local_7a8;
  allocator local_781;
  string local_780;
  string local_760;
  string local_740;
  string local_720;
  string local_700;
  string local_6e0;
  string local_6c0;
  string local_6a0;
  string local_680;
  string local_660;
  string local_640;
  string local_620;
  string local_600;
  string local_5e0;
  string local_5c0;
  string local_5a0;
  reference local_580;
  value_type *uvs;
  const_iterator __end2;
  const_iterator __begin2;
  unordered_map<unsigned_int,_tinyusdz::tydra::VertexAttribute,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_tinyusdz::tydra::VertexAttribute>_>_>
  *__range2;
  string local_540;
  string local_520;
  string local_500;
  string local_4e0;
  string local_4c0;
  string local_4a0;
  string local_480;
  string local_460;
  string local_440;
  string local_420;
  string local_400;
  string local_3e0;
  string local_3c0;
  string local_3a0;
  string local_380;
  string local_360;
  string local_340;
  string local_320;
  allocator local_2f9;
  string local_2f8;
  string local_2d8;
  string local_2b8;
  allocator local_291;
  string local_290;
  string local_270;
  string local_250;
  allocator local_229;
  string local_228;
  string local_208;
  string local_1e8;
  string local_1c8;
  stringstream local_1a8 [8];
  stringstream ss;
  ostream aoStack_198 [380];
  uint local_1c;
  RenderMesh *pRStack_18;
  uint32_t indent_local;
  RenderMesh *mesh_local;
  
  local_1c = (uint)mesh;
  pRStack_18 = (RenderMesh *)this;
  mesh_local = (RenderMesh *)__return_storage_ptr__;
  ::std::__cxx11::stringstream::stringstream(local_1a8);
  pprint::Indent_abi_cxx11_(&local_1c8,(pprint *)(ulong)local_1c,n);
  poVar2 = ::std::operator<<(aoStack_198,(string *)&local_1c8);
  ::std::operator<<(poVar2,"mesh {\n");
  ::std::__cxx11::string::~string((string *)&local_1c8);
  pprint::Indent_abi_cxx11_(&local_1e8,(pprint *)(ulong)(local_1c + 1),n_00);
  poVar2 = ::std::operator<<(aoStack_198,(string *)&local_1e8);
  poVar2 = ::std::operator<<(poVar2,"prim_name ");
  s = pRStack_18;
  ::std::allocator<char>::allocator();
  ::std::__cxx11::string::string((string *)&local_228,"\"",&local_229);
  quote(&local_208,&s->prim_name,&local_228);
  poVar2 = ::std::operator<<(poVar2,(string *)&local_208);
  ::std::operator<<(poVar2,"\n");
  ::std::__cxx11::string::~string((string *)&local_208);
  ::std::__cxx11::string::~string((string *)&local_228);
  ::std::allocator<char>::~allocator((allocator<char> *)&local_229);
  ::std::__cxx11::string::~string((string *)&local_1e8);
  pprint::Indent_abi_cxx11_(&local_250,(pprint *)(ulong)(local_1c + 1),n_01);
  poVar2 = ::std::operator<<(aoStack_198,(string *)&local_250);
  poVar2 = ::std::operator<<(poVar2,"abs_path ");
  psVar3 = &pRStack_18->abs_path;
  ::std::allocator<char>::allocator();
  ::std::__cxx11::string::string((string *)&local_290,"\"",&local_291);
  quote(&local_270,psVar3,&local_290);
  poVar2 = ::std::operator<<(poVar2,(string *)&local_270);
  ::std::operator<<(poVar2,"\n");
  ::std::__cxx11::string::~string((string *)&local_270);
  ::std::__cxx11::string::~string((string *)&local_290);
  ::std::allocator<char>::~allocator((allocator<char> *)&local_291);
  ::std::__cxx11::string::~string((string *)&local_250);
  pprint::Indent_abi_cxx11_(&local_2b8,(pprint *)(ulong)(local_1c + 1),n_02);
  poVar2 = ::std::operator<<(aoStack_198,(string *)&local_2b8);
  poVar2 = ::std::operator<<(poVar2,"display_name ");
  psVar3 = &pRStack_18->display_name;
  ::std::allocator<char>::allocator();
  ::std::__cxx11::string::string((string *)&local_2f8,"\"",&local_2f9);
  quote(&local_2d8,psVar3,&local_2f8);
  poVar2 = ::std::operator<<(poVar2,(string *)&local_2d8);
  ::std::operator<<(poVar2,"\n");
  ::std::__cxx11::string::~string((string *)&local_2d8);
  ::std::__cxx11::string::~string((string *)&local_2f8);
  ::std::allocator<char>::~allocator((allocator<char> *)&local_2f9);
  ::std::__cxx11::string::~string((string *)&local_2b8);
  pprint::Indent_abi_cxx11_(&local_320,(pprint *)(ulong)(local_1c + 1),n_03);
  poVar2 = ::std::operator<<(aoStack_198,(string *)&local_320);
  poVar2 = ::std::operator<<(poVar2,"num_points ");
  sVar4 = ::std::vector<std::array<float,_3UL>,_std::allocator<std::array<float,_3UL>_>_>::size
                    (&pRStack_18->points);
  ::std::__cxx11::to_string(&local_340,sVar4);
  poVar2 = ::std::operator<<(poVar2,(string *)&local_340);
  ::std::operator<<(poVar2,"\n");
  ::std::__cxx11::string::~string((string *)&local_340);
  ::std::__cxx11::string::~string((string *)&local_320);
  pprint::Indent_abi_cxx11_(&local_360,(pprint *)(ulong)(local_1c + 1),n_04);
  poVar2 = ::std::operator<<(aoStack_198,(string *)&local_360);
  poVar2 = ::std::operator<<(poVar2,"points \"");
  tinyusdz::value::print_array_snipped<std::array<float,3ul>>
            (&local_380,(value *)&pRStack_18->points,
             (vector<std::array<float,_3UL>,_std::allocator<std::array<float,_3UL>_>_> *)0x10,
             CONCAT44(in_register_0000000c,indent));
  poVar2 = ::std::operator<<(poVar2,(string *)&local_380);
  ::std::operator<<(poVar2,"\"\n");
  ::std::__cxx11::string::~string((string *)&local_380);
  ::std::__cxx11::string::~string((string *)&local_360);
  pprint::Indent_abi_cxx11_(&local_3a0,(pprint *)(ulong)(local_1c + 1),n_05);
  poVar2 = ::std::operator<<(aoStack_198,(string *)&local_3a0);
  poVar2 = ::std::operator<<(poVar2,"num_faceVertexCounts ");
  pvVar5 = RenderMesh::faceVertexCounts(pRStack_18);
  sVar4 = ::std::vector<unsigned_int,_std::allocator<unsigned_int>_>::size(pvVar5);
  ::std::__cxx11::to_string(&local_3c0,sVar4);
  poVar2 = ::std::operator<<(poVar2,(string *)&local_3c0);
  ::std::operator<<(poVar2,"\n");
  ::std::__cxx11::string::~string((string *)&local_3c0);
  ::std::__cxx11::string::~string((string *)&local_3a0);
  pprint::Indent_abi_cxx11_(&local_3e0,(pprint *)(ulong)(local_1c + 1),n_06);
  poVar2 = ::std::operator<<(aoStack_198,(string *)&local_3e0);
  poVar2 = ::std::operator<<(poVar2,"faceVertexCounts \"");
  pvVar5 = RenderMesh::faceVertexCounts(pRStack_18);
  tinyusdz::value::print_array_snipped<unsigned_int>(&local_400,pvVar5,0x10);
  poVar2 = ::std::operator<<(poVar2,(string *)&local_400);
  ::std::operator<<(poVar2,"\"\n");
  ::std::__cxx11::string::~string((string *)&local_400);
  ::std::__cxx11::string::~string((string *)&local_3e0);
  pprint::Indent_abi_cxx11_(&local_420,(pprint *)(ulong)(local_1c + 1),n_07);
  poVar2 = ::std::operator<<(aoStack_198,(string *)&local_420);
  poVar2 = ::std::operator<<(poVar2,"num_faceVertexIndices ");
  pvVar5 = RenderMesh::faceVertexIndices(pRStack_18);
  sVar4 = ::std::vector<unsigned_int,_std::allocator<unsigned_int>_>::size(pvVar5);
  ::std::__cxx11::to_string(&local_440,sVar4);
  poVar2 = ::std::operator<<(poVar2,(string *)&local_440);
  ::std::operator<<(poVar2,"\n");
  ::std::__cxx11::string::~string((string *)&local_440);
  ::std::__cxx11::string::~string((string *)&local_420);
  pprint::Indent_abi_cxx11_(&local_460,(pprint *)(ulong)(local_1c + 1),n_08);
  poVar2 = ::std::operator<<(aoStack_198,(string *)&local_460);
  poVar2 = ::std::operator<<(poVar2,"faceVertexIndices \"");
  pvVar5 = RenderMesh::faceVertexIndices(pRStack_18);
  tinyusdz::value::print_array_snipped<unsigned_int>(&local_480,pvVar5,0x10);
  poVar2 = ::std::operator<<(poVar2,(string *)&local_480);
  ::std::operator<<(poVar2,"\"\n");
  ::std::__cxx11::string::~string((string *)&local_480);
  ::std::__cxx11::string::~string((string *)&local_460);
  pprint::Indent_abi_cxx11_(&local_4a0,(pprint *)(ulong)(local_1c + 1),n_09);
  poVar2 = ::std::operator<<(aoStack_198,(string *)&local_4a0);
  poVar2 = ::std::operator<<(poVar2,"materialId ");
  ::std::__cxx11::to_string(&local_4c0,pRStack_18->material_id);
  poVar2 = ::std::operator<<(poVar2,(string *)&local_4c0);
  ::std::operator<<(poVar2,"\n");
  ::std::__cxx11::string::~string((string *)&local_4c0);
  ::std::__cxx11::string::~string((string *)&local_4a0);
  pprint::Indent_abi_cxx11_(&local_4e0,(pprint *)(ulong)(local_1c + 1),n_10);
  poVar2 = ::std::operator<<(aoStack_198,(string *)&local_4e0);
  poVar2 = ::std::operator<<(poVar2,"normals {\n");
  DumpVertexAttribute_abi_cxx11_
            (&local_500,(_anonymous_namespace_ *)&pRStack_18->normals,
             (VertexAttribute *)(ulong)(local_1c + 2),indent);
  poVar2 = ::std::operator<<(poVar2,(string *)&local_500);
  ::std::operator<<(poVar2,"\n");
  ::std::__cxx11::string::~string((string *)&local_500);
  ::std::__cxx11::string::~string((string *)&local_4e0);
  pprint::Indent_abi_cxx11_(&local_520,(pprint *)(ulong)(local_1c + 1),n_11);
  poVar2 = ::std::operator<<(aoStack_198,(string *)&local_520);
  ::std::operator<<(poVar2,"}\n");
  ::std::__cxx11::string::~string((string *)&local_520);
  pprint::Indent_abi_cxx11_(&local_540,(pprint *)(ulong)(local_1c + 1),n_12);
  poVar2 = ::std::operator<<(aoStack_198,(string *)&local_540);
  poVar2 = ::std::operator<<(poVar2,"num_texcoordSlots ");
  __val = ::std::
          unordered_map<unsigned_int,_tinyusdz::tydra::VertexAttribute,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_tinyusdz::tydra::VertexAttribute>_>_>
          ::size(&pRStack_18->texcoords);
  ::std::__cxx11::to_string((string *)&__range2,__val);
  poVar2 = ::std::operator<<(poVar2,(string *)&__range2);
  ::std::operator<<(poVar2,"\n");
  ::std::__cxx11::string::~string((string *)&__range2);
  ::std::__cxx11::string::~string((string *)&local_540);
  this_00 = &pRStack_18->texcoords;
  __end2 = ::std::
           unordered_map<unsigned_int,_tinyusdz::tydra::VertexAttribute,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_tinyusdz::tydra::VertexAttribute>_>_>
           ::begin(this_00);
  uvs = (value_type *)
        ::std::
        unordered_map<unsigned_int,_tinyusdz::tydra::VertexAttribute,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_tinyusdz::tydra::VertexAttribute>_>_>
        ::end(this_00);
  while( true ) {
    bVar1 = ::std::__detail::operator!=
                      (&__end2.
                        super__Node_iterator_base<std::pair<const_unsigned_int,_tinyusdz::tydra::VertexAttribute>,_false>
                       ,(_Node_iterator_base<std::pair<const_unsigned_int,_tinyusdz::tydra::VertexAttribute>,_false>
                         *)&uvs);
    if (!bVar1) break;
    local_580 = ::std::__detail::
                _Node_const_iterator<std::pair<const_unsigned_int,_tinyusdz::tydra::VertexAttribute>,_false,_false>
                ::operator*(&__end2);
    pprint::Indent_abi_cxx11_(&local_5a0,(pprint *)(ulong)(local_1c + 1),n_13);
    poVar2 = ::std::operator<<(aoStack_198,(string *)&local_5a0);
    poVar2 = ::std::operator<<(poVar2,"texcoords_");
    ::std::__cxx11::to_string(&local_5c0,local_580->first);
    poVar2 = ::std::operator<<(poVar2,(string *)&local_5c0);
    poVar2 = ::std::operator<<(poVar2," {\n");
    DumpVertexAttribute_abi_cxx11_
              (&local_5e0,(_anonymous_namespace_ *)&local_580->second,
               (VertexAttribute *)(ulong)(local_1c + 2),indent);
    poVar2 = ::std::operator<<(poVar2,(string *)&local_5e0);
    ::std::operator<<(poVar2,"\n");
    ::std::__cxx11::string::~string((string *)&local_5e0);
    ::std::__cxx11::string::~string((string *)&local_5c0);
    ::std::__cxx11::string::~string((string *)&local_5a0);
    pprint::Indent_abi_cxx11_(&local_600,(pprint *)(ulong)(local_1c + 1),n_14);
    poVar2 = ::std::operator<<(aoStack_198,(string *)&local_600);
    ::std::operator<<(poVar2,"}\n");
    ::std::__cxx11::string::~string((string *)&local_600);
    ::std::__detail::
    _Node_const_iterator<std::pair<const_unsigned_int,_tinyusdz::tydra::VertexAttribute>,_false,_false>
    ::operator++(&__end2);
  }
  sVar4 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size
                    ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                     &(pRStack_18->binormals).data);
  if (sVar4 != 0) {
    pprint::Indent_abi_cxx11_(&local_620,(pprint *)(ulong)(local_1c + 1),n_15);
    poVar2 = ::std::operator<<(aoStack_198,(string *)&local_620);
    poVar2 = ::std::operator<<(poVar2,"binormals {\n");
    DumpVertexAttribute_abi_cxx11_
              (&local_640,(_anonymous_namespace_ *)&pRStack_18->binormals,
               (VertexAttribute *)(ulong)(local_1c + 2),indent);
    poVar2 = ::std::operator<<(poVar2,(string *)&local_640);
    ::std::operator<<(poVar2,"\n");
    ::std::__cxx11::string::~string((string *)&local_640);
    ::std::__cxx11::string::~string((string *)&local_620);
    pprint::Indent_abi_cxx11_(&local_660,(pprint *)(ulong)(local_1c + 1),n_16);
    poVar2 = ::std::operator<<(aoStack_198,(string *)&local_660);
    ::std::operator<<(poVar2,"}\n");
    ::std::__cxx11::string::~string((string *)&local_660);
  }
  sVar4 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size
                    ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                     &(pRStack_18->tangents).data);
  n_19 = n_17;
  if (sVar4 != 0) {
    pprint::Indent_abi_cxx11_(&local_680,(pprint *)(ulong)(local_1c + 1),n_17);
    poVar2 = ::std::operator<<(aoStack_198,(string *)&local_680);
    poVar2 = ::std::operator<<(poVar2,"tangents {\n");
    DumpVertexAttribute_abi_cxx11_
              (&local_6a0,(_anonymous_namespace_ *)&pRStack_18->tangents,
               (VertexAttribute *)(ulong)(local_1c + 2),indent);
    poVar2 = ::std::operator<<(poVar2,(string *)&local_6a0);
    ::std::operator<<(poVar2,"\n");
    ::std::__cxx11::string::~string((string *)&local_6a0);
    ::std::__cxx11::string::~string((string *)&local_680);
    pprint::Indent_abi_cxx11_(&local_6c0,(pprint *)(ulong)(local_1c + 1),n_18);
    poVar2 = ::std::operator<<(aoStack_198,(string *)&local_6c0);
    ::std::operator<<(poVar2,"}\n");
    ::std::__cxx11::string::~string((string *)&local_6c0);
    n_19 = extraout_EDX;
  }
  pprint::Indent_abi_cxx11_(&local_6e0,(pprint *)(ulong)(local_1c + 1),n_19);
  poVar2 = ::std::operator<<(aoStack_198,(string *)&local_6e0);
  poVar2 = ::std::operator<<(poVar2,"skel_id ");
  poVar2 = (ostream *)::std::ostream::operator<<(poVar2,pRStack_18->skel_id);
  ::std::operator<<(poVar2,"\n");
  ::std::__cxx11::string::~string((string *)&local_6e0);
  sVar4 = ::std::vector<int,_std::allocator<int>_>::size
                    (&(pRStack_18->joint_and_weights).jointIndices);
  if (sVar4 != 0) {
    pprint::Indent_abi_cxx11_(&local_700,(pprint *)(ulong)(local_1c + 1),n_20);
    poVar2 = ::std::operator<<(aoStack_198,(string *)&local_700);
    ::std::operator<<(poVar2,"skin {\n");
    ::std::__cxx11::string::~string((string *)&local_700);
    pprint::Indent_abi_cxx11_(&local_720,(pprint *)(ulong)(local_1c + 2),n_21);
    poVar2 = ::std::operator<<(aoStack_198,(string *)&local_720);
    poVar2 = ::std::operator<<(poVar2,"geomBindTransform ");
    tinyusdz::to_string_abi_cxx11_(&local_760,(tinyusdz *)&pRStack_18->joint_and_weights,v);
    ::std::allocator<char>::allocator();
    ::std::__cxx11::string::string((string *)&local_780,"\"",&local_781);
    quote(&local_740,&local_760,&local_780);
    poVar2 = ::std::operator<<(poVar2,(string *)&local_740);
    ::std::operator<<(poVar2,"\n");
    ::std::__cxx11::string::~string((string *)&local_740);
    ::std::__cxx11::string::~string((string *)&local_780);
    ::std::allocator<char>::~allocator((allocator<char> *)&local_781);
    ::std::__cxx11::string::~string((string *)&local_760);
    ::std::__cxx11::string::~string((string *)&local_720);
    pprint::Indent_abi_cxx11_(&local_7a8,(pprint *)(ulong)(local_1c + 2),n_22);
    poVar2 = ::std::operator<<(aoStack_198,(string *)&local_7a8);
    poVar2 = ::std::operator<<(poVar2,"elementSize ");
    poVar2 = (ostream *)
             ::std::ostream::operator<<(poVar2,(pRStack_18->joint_and_weights).elementSize);
    ::std::operator<<(poVar2,"\n");
    ::std::__cxx11::string::~string((string *)&local_7a8);
    pprint::Indent_abi_cxx11_(&local_7c8,(pprint *)(ulong)(local_1c + 2),n_23);
    poVar2 = ::std::operator<<(aoStack_198,(string *)&local_7c8);
    poVar2 = ::std::operator<<(poVar2,"jointIndices ");
    tinyusdz::value::print_array_snipped<int>
              (&local_808,&(pRStack_18->joint_and_weights).jointIndices,0x10);
    ::std::allocator<char>::allocator();
    ::std::__cxx11::string::string((string *)&local_828,"\"",&local_829);
    quote(&local_7e8,&local_808,&local_828);
    poVar2 = ::std::operator<<(poVar2,(string *)&local_7e8);
    ::std::operator<<(poVar2,"\n");
    ::std::__cxx11::string::~string((string *)&local_7e8);
    ::std::__cxx11::string::~string((string *)&local_828);
    ::std::allocator<char>::~allocator((allocator<char> *)&local_829);
    ::std::__cxx11::string::~string((string *)&local_808);
    ::std::__cxx11::string::~string((string *)&local_7c8);
    pprint::Indent_abi_cxx11_(&local_850,(pprint *)(ulong)(local_1c + 2),n_24);
    poVar2 = ::std::operator<<(aoStack_198,(string *)&local_850);
    poVar2 = ::std::operator<<(poVar2,"jointWeights ");
    tinyusdz::value::print_array_snipped<float>
              (&local_890,&(pRStack_18->joint_and_weights).jointWeights,0x10);
    ::std::allocator<char>::allocator();
    ::std::__cxx11::string::string((string *)&local_8b0,"\"",&local_8b1);
    quote(&local_870,&local_890,&local_8b0);
    poVar2 = ::std::operator<<(poVar2,(string *)&local_870);
    ::std::operator<<(poVar2,"\n");
    ::std::__cxx11::string::~string((string *)&local_870);
    ::std::__cxx11::string::~string((string *)&local_8b0);
    ::std::allocator<char>::~allocator((allocator<char> *)&local_8b1);
    ::std::__cxx11::string::~string((string *)&local_890);
    ::std::__cxx11::string::~string((string *)&local_850);
    pprint::Indent_abi_cxx11_(&local_8d8,(pprint *)(ulong)(local_1c + 1),n_25);
    poVar2 = ::std::operator<<(aoStack_198,(string *)&local_8d8);
    ::std::operator<<(poVar2,"}\n");
    ::std::__cxx11::string::~string((string *)&local_8d8);
  }
  sVar6 = ::std::
          map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::tydra::ShapeTarget,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::tydra::ShapeTarget>_>_>
          ::size(&pRStack_18->targets);
  if (sVar6 != 0) {
    pprint::Indent_abi_cxx11_((string *)&__range3,(pprint *)(ulong)(local_1c + 1),n_26);
    poVar2 = ::std::operator<<(aoStack_198,(string *)&__range3);
    ::std::operator<<(poVar2,"shapeTargets {\n");
    ::std::__cxx11::string::~string((string *)&__range3);
    this_01 = &pRStack_18->targets;
    __end3 = ::std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::tydra::ShapeTarget,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::tydra::ShapeTarget>_>_>
             ::begin(this_01);
    target = (pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::tydra::ShapeTarget>
              *)::std::
                map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::tydra::ShapeTarget,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::tydra::ShapeTarget>_>_>
                ::end(this_01);
    while( true ) {
      bVar1 = ::std::operator!=(&__end3,(_Self *)&target);
      if (!bVar1) break;
      local_918 = ::std::
                  _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::tydra::ShapeTarget>_>
                  ::operator*(&__end3);
      pprint::Indent_abi_cxx11_(&local_938,(pprint *)(ulong)(local_1c + 2),n_28);
      poVar2 = ::std::operator<<(aoStack_198,(string *)&local_938);
      poVar2 = ::std::operator<<(poVar2,(string *)local_918);
      ::std::operator<<(poVar2," {\n");
      ::std::__cxx11::string::~string((string *)&local_938);
      pprint::Indent_abi_cxx11_(&local_958,(pprint *)(ulong)(local_1c + 3),n_29);
      poVar2 = ::std::operator<<(aoStack_198,(string *)&local_958);
      poVar2 = ::std::operator<<(poVar2,"prim_name ");
      pSVar7 = &local_918->second;
      ::std::allocator<char>::allocator();
      ::std::__cxx11::string::string((string *)&local_998,"\"",&local_999);
      quote(&local_978,&pSVar7->prim_name,&local_998);
      poVar2 = ::std::operator<<(poVar2,(string *)&local_978);
      ::std::operator<<(poVar2,"\n");
      ::std::__cxx11::string::~string((string *)&local_978);
      ::std::__cxx11::string::~string((string *)&local_998);
      ::std::allocator<char>::~allocator((allocator<char> *)&local_999);
      ::std::__cxx11::string::~string((string *)&local_958);
      pprint::Indent_abi_cxx11_(&local_9c0,(pprint *)(ulong)(local_1c + 3),n_30);
      poVar2 = ::std::operator<<(aoStack_198,(string *)&local_9c0);
      poVar2 = ::std::operator<<(poVar2,"abs_path ");
      pSVar7 = &local_918->second;
      ::std::allocator<char>::allocator();
      ::std::__cxx11::string::string((string *)&local_a00,"\"",&local_a01);
      quote(&local_9e0,&pSVar7->abs_path,&local_a00);
      poVar2 = ::std::operator<<(poVar2,(string *)&local_9e0);
      ::std::operator<<(poVar2,"\n");
      ::std::__cxx11::string::~string((string *)&local_9e0);
      ::std::__cxx11::string::~string((string *)&local_a00);
      ::std::allocator<char>::~allocator((allocator<char> *)&local_a01);
      ::std::__cxx11::string::~string((string *)&local_9c0);
      pprint::Indent_abi_cxx11_(&local_a28,(pprint *)(ulong)(local_1c + 3),n_31);
      poVar2 = ::std::operator<<(aoStack_198,(string *)&local_a28);
      poVar2 = ::std::operator<<(poVar2,"display_name ");
      pSVar7 = &local_918->second;
      ::std::allocator<char>::allocator();
      ::std::__cxx11::string::string((string *)&local_a68,"\"",&local_a69);
      quote(&local_a48,&pSVar7->display_name,&local_a68);
      poVar2 = ::std::operator<<(poVar2,(string *)&local_a48);
      ::std::operator<<(poVar2,"\n");
      ::std::__cxx11::string::~string((string *)&local_a48);
      ::std::__cxx11::string::~string((string *)&local_a68);
      ::std::allocator<char>::~allocator((allocator<char> *)&local_a69);
      ::std::__cxx11::string::~string((string *)&local_a28);
      pprint::Indent_abi_cxx11_(&local_a90,(pprint *)(ulong)(local_1c + 3),n_32);
      poVar2 = ::std::operator<<(aoStack_198,(string *)&local_a90);
      poVar2 = ::std::operator<<(poVar2,"pointIndices ");
      tinyusdz::value::print_array_snipped<unsigned_int>
                (&local_ad0,&(local_918->second).pointIndices,0x10);
      ::std::allocator<char>::allocator();
      ::std::__cxx11::string::string((string *)&local_af0,"\"",&local_af1);
      quote(&local_ab0,&local_ad0,&local_af0);
      poVar2 = ::std::operator<<(poVar2,(string *)&local_ab0);
      ::std::operator<<(poVar2,"\n");
      ::std::__cxx11::string::~string((string *)&local_ab0);
      ::std::__cxx11::string::~string((string *)&local_af0);
      ::std::allocator<char>::~allocator((allocator<char> *)&local_af1);
      ::std::__cxx11::string::~string((string *)&local_ad0);
      ::std::__cxx11::string::~string((string *)&local_a90);
      pprint::Indent_abi_cxx11_(&local_b18,(pprint *)(ulong)(local_1c + 3),n_33);
      poVar2 = ::std::operator<<(aoStack_198,(string *)&local_b18);
      poVar2 = ::std::operator<<(poVar2,"pointOffsets ");
      tinyusdz::value::print_array_snipped<std::array<float,3ul>>
                (&local_b58,(value *)&(local_918->second).pointOffsets,
                 (vector<std::array<float,_3UL>,_std::allocator<std::array<float,_3UL>_>_> *)0x10,
                 CONCAT44(in_register_0000000c,indent));
      ::std::allocator<char>::allocator();
      ::std::__cxx11::string::string((string *)&local_b78,"\"",&local_b79);
      quote(&local_b38,&local_b58,&local_b78);
      poVar2 = ::std::operator<<(poVar2,(string *)&local_b38);
      ::std::operator<<(poVar2,"\n");
      ::std::__cxx11::string::~string((string *)&local_b38);
      ::std::__cxx11::string::~string((string *)&local_b78);
      ::std::allocator<char>::~allocator((allocator<char> *)&local_b79);
      ::std::__cxx11::string::~string((string *)&local_b58);
      ::std::__cxx11::string::~string((string *)&local_b18);
      pprint::Indent_abi_cxx11_(&local_ba0,(pprint *)(ulong)(local_1c + 3),n_34);
      poVar2 = ::std::operator<<(aoStack_198,(string *)&local_ba0);
      poVar2 = ::std::operator<<(poVar2,"normalOffsets ");
      tinyusdz::value::print_array_snipped<std::array<float,3ul>>
                (&local_be0,(value *)&(local_918->second).normalOffsets,
                 (vector<std::array<float,_3UL>,_std::allocator<std::array<float,_3UL>_>_> *)0x10,
                 CONCAT44(in_register_0000000c,indent));
      ::std::allocator<char>::allocator();
      ::std::__cxx11::string::string((string *)&local_c00,"\"",&local_c01);
      quote(&local_bc0,&local_be0,&local_c00);
      poVar2 = ::std::operator<<(poVar2,(string *)&local_bc0);
      ::std::operator<<(poVar2,"\n");
      ::std::__cxx11::string::~string((string *)&local_bc0);
      ::std::__cxx11::string::~string((string *)&local_c00);
      ::std::allocator<char>::~allocator((allocator<char> *)&local_c01);
      ::std::__cxx11::string::~string((string *)&local_be0);
      ::std::__cxx11::string::~string((string *)&local_ba0);
      pprint::Indent_abi_cxx11_(&local_c28,(pprint *)(ulong)(local_1c + 2),n_35);
      poVar2 = ::std::operator<<(aoStack_198,(string *)&local_c28);
      ::std::operator<<(poVar2,"}\n");
      ::std::__cxx11::string::~string((string *)&local_c28);
      ::std::
      _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::tydra::ShapeTarget>_>
      ::operator++(&__end3);
    }
    pprint::Indent_abi_cxx11_(&local_c48,(pprint *)(ulong)(local_1c + 1),n_27);
    poVar2 = ::std::operator<<(aoStack_198,(string *)&local_c48);
    ::std::operator<<(poVar2,"}\n");
    ::std::__cxx11::string::~string((string *)&local_c48);
  }
  sVar8 = ::std::
          map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::tydra::MaterialSubset,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::tydra::MaterialSubset>_>_>
          ::size(&pRStack_18->material_subsetMap);
  if (sVar8 != 0) {
    pprint::Indent_abi_cxx11_((string *)&__range3_1,(pprint *)(ulong)(local_1c + 1),n_36);
    poVar2 = ::std::operator<<(aoStack_198,(string *)&__range3_1);
    ::std::operator<<(poVar2,"material_subsets {\n");
    ::std::__cxx11::string::~string((string *)&__range3_1);
    this_02 = &pRStack_18->material_subsetMap;
    __end3_1 = ::std::
               map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::tydra::MaterialSubset,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::tydra::MaterialSubset>_>_>
               ::begin(this_02);
    msubset = (pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::tydra::MaterialSubset>
               *)::std::
                 map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::tydra::MaterialSubset,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::tydra::MaterialSubset>_>_>
                 ::end(this_02);
    while( true ) {
      bVar1 = ::std::operator!=(&__end3_1,(_Self *)&msubset);
      if (!bVar1) break;
      local_c88 = ::std::
                  _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::tydra::MaterialSubset>_>
                  ::operator*(&__end3_1);
      anon_unknown_0::DumpMaterialSubset((stringstream *)local_1a8,&local_c88->second,local_1c + 2);
      ::std::
      _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::tydra::MaterialSubset>_>
      ::operator++(&__end3_1);
    }
    pprint::Indent_abi_cxx11_(&local_ca8,(pprint *)(ulong)(local_1c + 1),n_37);
    poVar2 = ::std::operator<<(aoStack_198,(string *)&local_ca8);
    ::std::operator<<(poVar2,"}\n");
    ::std::__cxx11::string::~string((string *)&local_ca8);
  }
  ::std::operator<<(aoStack_198,"\n");
  pprint::Indent_abi_cxx11_(&local_cc8,(pprint *)(ulong)local_1c,n_38);
  poVar2 = ::std::operator<<(aoStack_198,(string *)&local_cc8);
  ::std::operator<<(poVar2,"}\n");
  ::std::__cxx11::string::~string((string *)&local_cc8);
  ::std::__cxx11::stringstream::str();
  ::std::__cxx11::stringstream::~stringstream(local_1a8);
  return __return_storage_ptr__;
}

Assistant:

std::string DumpMesh(const RenderMesh &mesh, uint32_t indent) {
  std::stringstream ss;

  ss << pprint::Indent(indent) << "mesh {\n";

  ss << pprint::Indent(indent + 1) << "prim_name " << quote(mesh.prim_name)
     << "\n";
  ss << pprint::Indent(indent + 1) << "abs_path " << quote(mesh.abs_path)
     << "\n";
  ss << pprint::Indent(indent + 1) << "display_name "
     << quote(mesh.display_name) << "\n";
  ss << pprint::Indent(indent + 1) << "num_points "
     << std::to_string(mesh.points.size()) << "\n";
  ss << pprint::Indent(indent + 1) << "points \""
     << value::print_array_snipped(mesh.points) << "\"\n";
  ss << pprint::Indent(indent + 1) << "num_faceVertexCounts "
     << std::to_string(mesh.faceVertexCounts().size()) << "\n";
  ss << pprint::Indent(indent + 1) << "faceVertexCounts \""
     << value::print_array_snipped(mesh.faceVertexCounts()) << "\"\n";
  ss << pprint::Indent(indent + 1) << "num_faceVertexIndices "
     << std::to_string(mesh.faceVertexIndices().size()) << "\n";
  ss << pprint::Indent(indent + 1) << "faceVertexIndices \""
     << value::print_array_snipped(mesh.faceVertexIndices()) << "\"\n";
  ss << pprint::Indent(indent + 1) << "materialId "
     << std::to_string(mesh.material_id) << "\n";
  ss << pprint::Indent(indent + 1) << "normals {\n"
     << DumpVertexAttribute(mesh.normals, indent + 2) << "\n";
  ss << pprint::Indent(indent + 1) << "}\n";
  ss << pprint::Indent(indent + 1) << "num_texcoordSlots "
     << std::to_string(mesh.texcoords.size()) << "\n";
  for (const auto &uvs : mesh.texcoords) {
    ss << pprint::Indent(indent + 1) << "texcoords_"
       << std::to_string(uvs.first) << " {\n"
       << DumpVertexAttribute(uvs.second, indent + 2) << "\n";
    ss << pprint::Indent(indent + 1) << "}\n";
  }
  if (mesh.binormals.data.size()) {
    ss << pprint::Indent(indent + 1) << "binormals {\n"
       << DumpVertexAttribute(mesh.binormals, indent + 2) << "\n";
    ss << pprint::Indent(indent + 1) << "}\n";
  }
  if (mesh.tangents.data.size()) {
    ss << pprint::Indent(indent + 1) << "tangents {\n"
       << DumpVertexAttribute(mesh.tangents, indent + 2) << "\n";
    ss << pprint::Indent(indent + 1) << "}\n";
  }

  ss << pprint::Indent(indent + 1) << "skel_id " << mesh.skel_id << "\n";

  if (mesh.joint_and_weights.jointIndices.size()) {
    ss << pprint::Indent(indent + 1) << "skin {\n";
    ss << pprint::Indent(indent + 2) << "geomBindTransform "
       << quote(tinyusdz::to_string(mesh.joint_and_weights.geomBindTransform))
       << "\n";
    ss << pprint::Indent(indent + 2) << "elementSize "
       << mesh.joint_and_weights.elementSize << "\n";
    ss << pprint::Indent(indent + 2) << "jointIndices "
       << quote(value::print_array_snipped(mesh.joint_and_weights.jointIndices))
       << "\n";
    ss << pprint::Indent(indent + 2) << "jointWeights "
       << quote(value::print_array_snipped(mesh.joint_and_weights.jointWeights))
       << "\n";
    ss << pprint::Indent(indent + 1) << "}\n";
  }
  if (mesh.targets.size()) {
    ss << pprint::Indent(indent + 1) << "shapeTargets {\n";

    for (const auto &target : mesh.targets) {
      ss << pprint::Indent(indent + 2) << target.first << " {\n";
      ss << pprint::Indent(indent + 3) << "prim_name " << quote(target.second.prim_name) << "\n";
      ss << pprint::Indent(indent + 3) << "abs_path " << quote(target.second.abs_path) << "\n";
      ss << pprint::Indent(indent + 3) << "display_name " << quote(target.second.display_name) << "\n";
      ss << pprint::Indent(indent + 3) << "pointIndices " << quote(value::print_array_snipped(target.second.pointIndices)) << "\n";
      ss << pprint::Indent(indent + 3) << "pointOffsets " << quote(value::print_array_snipped(target.second.pointOffsets)) << "\n";
      ss << pprint::Indent(indent + 3) << "normalOffsets " << quote(value::print_array_snipped(target.second.normalOffsets)) << "\n";
      ss << pprint::Indent(indent + 2) << "}\n";
    }

    ss << pprint::Indent(indent + 1) << "}\n";

  }
  if (mesh.material_subsetMap.size()) {
    ss << pprint::Indent(indent + 1) << "material_subsets {\n";
    for (const auto &msubset : mesh.material_subsetMap) {
      DumpMaterialSubset(ss, msubset.second, indent + 2);
    }
    ss << pprint::Indent(indent + 1) << "}\n";
  }

  // TODO: primvars

  ss << "\n";

  ss << pprint::Indent(indent) << "}\n";

  return ss.str();
}